

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::ProbRewardForjoahI
          (BayesianGameForDecPOMDPStage *this,Index ts,Index jtI,Index *jaI_arr,Index *joI_arr,
          Index *jaohI,double *PjaohI,double *ExpR_0_prevTS_thisJAOH)

{
  _func_int *p_Var1;
  bool bVar2;
  Index IVar3;
  LIndex i;
  DecPOMDPDiscreteInterface *pDVar4;
  long in_RCX;
  uint in_ESI;
  JointActionObservationHistoryTree *in_RDI;
  long in_R8;
  Index *in_R9;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double *in_stack_00000008;
  double *in_stack_00000010;
  double R_si_ja;
  BeliefIteratorGeneric it;
  double ExpR_0_prevTS_thisJAOH_thisT;
  Index tI;
  JointBeliefInterface *jb;
  double CPjaohI;
  JointActionObservationHistoryTree *jaoht;
  Index in_stack_ffffffffffffff18;
  Index in_stack_ffffffffffffff1c;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff20;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff30;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff38;
  Index in_stack_ffffffffffffff78;
  undefined1 local_60 [16];
  double local_50;
  uint local_44;
  PlanningUnitMADPDiscrete *local_40;
  double local_38;
  JointActionObservationHistoryTree *local_30;
  Index *local_28;
  long local_20;
  long local_18;
  uint local_c;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_ESI;
  local_30 = PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree
                       (in_stack_ffffffffffffff38,(LIndex)in_stack_ffffffffffffff30);
  local_38 = 1.0;
  *in_stack_00000008 = 1.0;
  local_40 = (PlanningUnitMADPDiscrete *)
             PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_ffffffffffffff30);
  local_44 = 0;
  while (local_44 < local_c) {
    local_50 = 0.0;
    p_Var1 = (local_40->super_PlanningUnit)._vptr_PlanningUnit[-0x17];
    (**(code **)(*(long *)((long)&(local_40->super_PlanningUnit)._vptr_PlanningUnit + (long)p_Var1)
                + 0x98))
              (local_60,(_func_int *)
                        ((long)&(local_40->super_PlanningUnit)._vptr_PlanningUnit + (long)p_Var1));
    do {
      IVar3 = BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8b6fa0);
      auVar6._0_8_ = PlanningUnitDecPOMDPDiscrete::GetReward
                               (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                in_stack_ffffffffffffff18);
      dVar5 = BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8b6fea);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5;
      auVar6._8_8_ = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_50;
      auVar6 = vfmadd213sd_fma(auVar6,auVar7,auVar8);
      local_50 = auVar6._0_8_;
      bVar2 = BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8b7025);
    } while (bVar2);
    dVar5 = *in_stack_00000010 + local_50;
    *in_stack_00000010 = dVar5;
    local_30 = JointActionObservationHistoryTree::GetSuccessor
                         (in_RDI,IVar3,in_stack_ffffffffffffff78);
    i = TreeNode<JointActionObservationHistory>::GetIndex
                  ((TreeNode<JointActionObservationHistory> *)in_stack_ffffffffffffff30);
    IVar3 = Globals::CastLIndexToIndex(i);
    *local_28 = IVar3;
    in_stack_ffffffffffffff30 = local_40;
    pDVar4 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       (*(PlanningUnitDecPOMDPDiscrete **)
                         &in_RDI[2].super_TreeNode<JointActionObservationHistory>._m_indexValid);
    (*(in_stack_ffffffffffffff30->super_PlanningUnit)._vptr_PlanningUnit[0x16])
              (in_stack_ffffffffffffff30,&pDVar4->field_0x0 + *(long *)(*(long *)pDVar4 + -0xb8),
               (ulong)*(uint *)(local_18 + (ulong)local_44 * 4),
               (ulong)*(uint *)(local_20 + (ulong)local_44 * 4));
    *in_stack_00000008 = *in_stack_00000008 * dVar5;
    local_44 = local_44 + 1;
    local_38 = dVar5;
    BeliefIteratorGeneric::~BeliefIteratorGeneric
              ((BeliefIteratorGeneric *)in_stack_ffffffffffffff20);
  }
  if (local_40 != (PlanningUnitMADPDiscrete *)0x0) {
    (*(local_40->super_PlanningUnit)._vptr_PlanningUnit[1])();
  }
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::ProbRewardForjoahI(
        //input args
        Index ts, Index jtI, Index* jaI_arr,Index* joI_arr, 
        //output args
        Index& jaohI, double& PjaohI, double& ExpR_0_prevTS_thisJAOH )
{
    //first we get the initial jaoh
    JointActionObservationHistoryTree * jaoht = 
        _m_pu->GetJointActionObservationHistoryTree(0);

    double CPjaohI = 1.0; 
    PjaohI = CPjaohI; // == 1.0

    // get the initaal belief
    JointBeliefInterface* jb = _m_pu->GetNewJointBeliefFromISD();

    Index tI = 0;
    while(tI < ts)
    {
        //calculate the R for tI
        double ExpR_0_prevTS_thisJAOH_thisT = 0.0;
#if USE_BeliefIteratorGeneric
        BeliefIteratorGeneric it=jb->GetIterator();
        do
        {
            double R_si_ja = _m_pu->GetReward(it.GetStateIndex(), jaI_arr[tI]); 
            if(DEBUG_BG4DECPOMDP4) 
                cout << "R(s="<<it.GetStateIndex()<<",ja="<<jaI_arr[tI]<<")="<< R_si_ja << "\n";
            ExpR_0_prevTS_thisJAOH_thisT += it.GetProbability() * R_si_ja;
        } while(it.Next());
#else
        for(Index sI=0; sI < _m_pu->GetNrStates(); sI++)
        {
            double R_si_ja = _m_pu->GetReward(sI, jaI_arr[tI]); 
            if(DEBUG_BG4DECPOMDP4) 
                cout << "R(s="<<sI<<",ja="<<jaI_arr[tI]<<")="<< R_si_ja << "\n";
            ExpR_0_prevTS_thisJAOH_thisT += jb->Get(sI) * R_si_ja;
        }
#endif
        ExpR_0_prevTS_thisJAOH += ExpR_0_prevTS_thisJAOH_thisT;
        if(DEBUG_BG4DECPOMDP4)
        {
            cout << "calculating expected reward R(oaHist,a) for tI="<<tI
                <<"oaHist:"; jaoht->GetJointActionObservationHistory()->Print();
            cout << endl; cout << "R(b,a) (exp reward for jtI="  << jtI << 
                ", tI="<<tI<<") is "<< ExpR_0_prevTS_thisJAOH_thisT <<endl;

        }
            jaoht = jaoht->GetSuccessor( jaI_arr[tI], joI_arr[tI] );
            jaohI = CastLIndexToIndex(jaoht->GetIndex());

            CPjaohI = jb->Update( *_m_pu->GetDPOMDPD(), jaI_arr[tI], joI_arr[tI]  );
        PjaohI =  PjaohI * CPjaohI;     
        tI++;
    }
    delete jb; //free the belief allocated with 'new'
    if(DEBUG_BG4DECPOMDP4)
    {
        cout << "expected previous reward (up to ts-1) for (jtI="  << jtI << 
            ") ";
        jaoht->GetJointActionObservationHistory()->Print();
        cout << " is "<< ExpR_0_prevTS_thisJAOH <<endl << endl;
    }
}